

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QSize __thiscall QDockAreaLayoutInfo::minimumSize(QDockAreaLayoutInfo *this)

{
  Representation RVar1;
  bool bVar2;
  bool bVar3;
  QSize QVar4;
  ulong uVar5;
  Representation RVar6;
  int iVar7;
  Representation RVar8;
  uint uVar9;
  Orientation OVar10;
  ulong uVar11;
  uint uVar12;
  QDockAreaLayoutItem *this_00;
  ulong uVar13;
  long lVar14;
  
  uVar13 = 0xffffffffffffffff;
  uVar11 = 0;
  lVar14 = 0;
  do {
    uVar13 = uVar13 + 1;
    if ((ulong)(this->item_list).d.size <= uVar13) {
      uVar9 = 0;
      goto LAB_003ed819;
    }
    bVar2 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&((this->item_list).d.ptr)->widgetItem + lVar14));
    lVar14 = lVar14 + 0x28;
  } while (bVar2);
  if ((this->item_list).d.size == 0) {
    uVar9 = 0;
    uVar13 = 0;
  }
  else {
    lVar14 = 0;
    bVar2 = true;
    uVar11 = 0;
    uVar13 = 0;
    uVar9 = 0;
    do {
      uVar12 = (uint)uVar13;
      this_00 = (QDockAreaLayoutItem *)((long)&((this->item_list).d.ptr)->widgetItem + lVar14);
      bVar3 = QDockAreaLayoutItem::skip(this_00);
      if (!bVar3) {
        QVar4 = QDockAreaLayoutItem::minimumSize(this_00);
        RVar6 = QVar4.ht.m_i;
        RVar1 = QVar4.wd.m_i;
        if (this->tabbed == true) {
          OVar10 = this->o;
          RVar8.m_i = RVar6.m_i;
          if (OVar10 == Horizontal) {
            RVar8.m_i = RVar1.m_i;
          }
          if (RVar8.m_i < (int)uVar12) {
            RVar8.m_i = uVar12;
          }
        }
        else {
          if (!bVar2) {
            uVar12 = uVar12 + *this->sep;
          }
          OVar10 = this->o;
          RVar8.m_i = RVar6.m_i;
          if (OVar10 == Horizontal) {
            RVar8.m_i = RVar1.m_i;
          }
          RVar8.m_i = RVar8.m_i + uVar12;
        }
        if (OVar10 == Vertical) {
          RVar6.m_i = RVar1.m_i;
        }
        if (RVar6.m_i < (int)uVar9) {
          RVar6.m_i = uVar9;
        }
        uVar9 = RVar6.m_i;
        bVar2 = false;
        uVar13 = (ulong)(uint)RVar8.m_i;
      }
      uVar11 = uVar11 + 1;
      lVar14 = lVar14 + 0x28;
    } while (uVar11 < (ulong)(this->item_list).d.size);
  }
  uVar12 = (uint)uVar13;
  if (this->o == Horizontal) {
    uVar13 = (ulong)uVar9;
    uVar9 = uVar12;
  }
  else if (this->o != Vertical) {
    uVar13 = (ulong)uVar9;
    uVar9 = 0xffffffff;
  }
  bVar2 = updateTabBar(this);
  if (bVar2) {
    uVar5 = (**(code **)(*(long *)&this->tabBar->super_QWidget + 0x78))();
  }
  else {
    uVar5 = 0;
  }
  uVar12 = (uint)uVar5;
  uVar11 = uVar13;
  if ((uVar5 >> 0x20 != 0 || uVar12 != 0) && ((uint)this->tabBarShape < 8)) {
    iVar7 = (int)(uVar5 >> 0x20);
    if ((0x33U >> (this->tabBarShape & 0x1fU) & 1) == 0) {
      uVar11 = uVar5 >> 0x20;
      if (iVar7 < (int)uVar13) {
        uVar11 = uVar13;
      }
      uVar9 = uVar9 + uVar12;
    }
    else {
      uVar11 = (ulong)(uint)((int)uVar13 + iVar7);
      if ((int)uVar9 <= (int)uVar12) {
        uVar9 = uVar12;
      }
    }
  }
LAB_003ed819:
  return (QSize)((ulong)uVar9 | uVar11 << 0x20);
}

Assistant:

QSize QDockAreaLayoutInfo::minimumSize() const
{
    if (isEmpty())
        return QSize(0, 0);

    int a = 0, b = 0;
    bool first = true;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

        QSize min_size = item.minimumSize();
#if QT_CONFIG(tabbar)
        if (tabbed) {
            a = qMax(a, pick(o, min_size));
        } else
#endif
        {
            if (!first)
                a += *sep;
            a += pick(o, min_size);
        }
        b = qMax(b, perp(o, min_size));

        first = false;
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

#if QT_CONFIG(tabbar)
    QSize tbm = tabBarMinimumSize();
    if (!tbm.isNull()) {
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::RoundedSouth:
            case QTabBar::TriangularNorth:
            case QTabBar::TriangularSouth:
                result.rheight() += tbm.height();
                result.rwidth() = qMax(tbm.width(), result.width());
                break;
            case QTabBar::RoundedEast:
            case QTabBar::RoundedWest:
            case QTabBar::TriangularEast:
            case QTabBar::TriangularWest:
                result.rheight() = qMax(tbm.height(), result.height());
                result.rwidth() += tbm.width();
                break;
            default:
                break;
        }
    }
#endif // QT_CONFIG(tabbar)

    return result;
}